

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffcdel(fitsfile *fptr,LONGLONG naxis1,LONGLONG naxis2,LONGLONG ndelete,LONGLONG bytepos,
          int *status)

{
  uchar *values;
  fitsfile *pfVar1;
  int *piVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int *in_R9;
  LONGLONG nbytes;
  LONGLONG remain;
  LONGLONG newlen;
  LONGLONG nseg;
  LONGLONG irow;
  LONGLONG ii;
  LONGLONG i2;
  LONGLONG i1;
  uchar buffer [10000];
  int *local_2788;
  int *in_stack_ffffffffffffd880;
  LONGLONG in_stack_ffffffffffffd890;
  long lVar3;
  long firstchar;
  LONGLONG in_stack_ffffffffffffd8a0;
  long lVar4;
  int *in_stack_ffffffffffffd8e0;
  uchar *in_stack_ffffffffffffd8e8;
  LONGLONG in_stack_ffffffffffffd8f0;
  LONGLONG in_stack_ffffffffffffd8f8;
  LONGLONG in_stack_ffffffffffffd900;
  fitsfile *in_stack_ffffffffffffd908;
  int local_4;
  
  if (*in_R9 < 1) {
    if (in_RDX == 0) {
      local_4 = *in_R9;
    }
    else {
      values = (uchar *)(in_RSI - in_RCX);
      if ((long)values < 0x2711) {
        pfVar1 = (fitsfile *)(in_R8 + 1 + in_RCX);
        for (lVar3 = 1; lVar3 < in_RDX; lVar3 = lVar3 + 1) {
          ffgtbb(pfVar1,in_stack_ffffffffffffd8a0,lVar3,in_stack_ffffffffffffd890,values,
                 in_stack_ffffffffffffd880);
          *(uchar **)(*(long *)(in_RDI + 8) + 0x3c8) = values;
          ffptbb(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8,
                 in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8e8,in_stack_ffffffffffffd8e0);
          *(long *)(*(long *)(in_RDI + 8) + 0x3c8) = in_RSI;
        }
        piVar2 = (int *)(in_RSI - (in_R8 + in_RCX));
        if (0 < (long)piVar2) {
          ffgtbb(pfVar1,in_stack_ffffffffffffd8a0,lVar3,in_stack_ffffffffffffd890,values,piVar2);
          *(uchar **)(*(long *)(in_RDI + 8) + 0x3c8) = values;
          ffptbb(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8,
                 in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8e8,in_stack_ffffffffffffd8e0);
          *(long *)(*(long *)(in_RDI + 8) + 0x3c8) = in_RSI;
        }
      }
      else {
        lVar3 = (long)(values + 9999) / 10000;
        for (firstchar = 1; firstchar < in_RDX; firstchar = firstchar + 1) {
          pfVar1 = (fitsfile *)(in_R8 + 1 + in_RCX);
          local_2788 = (int *)(values + (lVar3 + -1) * -10000);
          for (lVar4 = 0; lVar4 < lVar3; lVar4 = lVar4 + 1) {
            ffgtbb(pfVar1,lVar4,firstchar,lVar3,values,in_stack_ffffffffffffd880);
            *(uchar **)(*(long *)(in_RDI + 8) + 0x3c8) = values;
            ffptbb(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8,
                   in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8e8,in_stack_ffffffffffffd8e0);
            *(long *)(*(long *)(in_RDI + 8) + 0x3c8) = in_RSI;
            pfVar1 = (fitsfile *)((long)local_2788 + (long)pfVar1);
            local_2788 = (int *)0x2710;
          }
        }
        piVar2 = (int *)(in_RSI - (in_R8 + in_RCX));
        if (0 < (long)piVar2) {
          lVar3 = ((long)piVar2 + 9999) / 10000;
          pfVar1 = (fitsfile *)(in_R8 + 1 + in_RCX);
          local_2788 = piVar2 + (lVar3 + -1) * -0x9c4;
          for (lVar4 = 0; lVar4 < lVar3; lVar4 = lVar4 + 1) {
            ffgtbb(pfVar1,lVar4,firstchar,lVar3,values,piVar2);
            *(uchar **)(*(long *)(in_RDI + 8) + 0x3c8) = values;
            ffptbb(in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8,
                   in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8e8,in_stack_ffffffffffffd8e0);
            *(long *)(*(long *)(in_RDI + 8) + 0x3c8) = in_RSI;
            pfVar1 = (fitsfile *)((long)local_2788 + (long)pfVar1);
            local_2788 = (int *)0x2710;
          }
        }
      }
      local_4 = *in_R9;
    }
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffcdel(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis1,     /* I - width of the table, in bytes             */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           LONGLONG ndelete,    /* I - number of bytes to delete in each row    */
           LONGLONG bytepos,    /* I - rel. position in row to delete bytes     */
           int *status)     /* IO - error status                            */
/*
 delete 'ndelete' bytes from each row of the table at position 'bytepos'.  */
{
    unsigned char buffer[10000];
    LONGLONG i1, i2, ii, irow, nseg;
    LONGLONG newlen, remain, nbytes;

    if (*status > 0)
        return(*status);

    if (naxis2 == 0)
        return(*status);  /* just return if there are 0 rows in the table */

    newlen = naxis1 - ndelete;

    if (newlen <= 10000)
    {
      /*******************************************************************
      CASE #1: optimal case where whole new row fits in the work buffer
      *******************************************************************/
      i1 = bytepos + 1;
      i2 = i1 + ndelete;
      for (irow = 1; irow < naxis2; irow++)
      {
        ffgtbb(fptr, irow, i2, newlen, buffer, status); /* read row */
        (fptr->Fptr)->rowlength = newlen;  /* new row length */

        ffptbb(fptr, irow, i1, newlen, buffer, status); /* write row */
        (fptr->Fptr)->rowlength = naxis1;  /* reset to orig value */
      }

      /* now do the last row */
      remain = naxis1 - (bytepos + ndelete);

      if (remain > 0)
      {
        ffgtbb(fptr, naxis2, i2, remain, buffer, status); /* read row */
        (fptr->Fptr)->rowlength = newlen;  /* new row length */

        ffptbb(fptr, naxis2, i1, remain, buffer, status); /* write row */
        (fptr->Fptr)->rowlength = naxis1;  /* reset to orig value */
      }
    }
    else
    {
        /*****************************************************************
        CASE #2:  whole row doesn't fit in work buffer; move row in pieces
        ******************************************************************/

        nseg = (newlen + 9999) / 10000;
        for (irow = 1; irow < naxis2; irow++)
        {
          i1 = bytepos + 1;
          i2 = i1 + ndelete;

          nbytes = newlen - (nseg - 1) * 10000;
          for (ii = 0; ii < nseg; ii++)
          { 
            ffgtbb(fptr, irow, i2, nbytes, buffer, status); /* read bytes */
            (fptr->Fptr)->rowlength = newlen;  /* new row length */

            ffptbb(fptr, irow, i1, nbytes, buffer, status); /* rewrite bytes */
            (fptr->Fptr)->rowlength = naxis1; /* reset to orig value */

            i1 += nbytes;
            i2 += nbytes;
            nbytes = 10000;
          }
        }

        /* now do the last row */
        remain = naxis1 - (bytepos + ndelete);

        if (remain > 0)
        {
          nseg = (remain + 9999) / 10000;
          i1 = bytepos + 1;
          i2 = i1 + ndelete;
          nbytes = remain - (nseg - 1) * 10000;
          for (ii = 0; ii < nseg; ii++)
          { 
            ffgtbb(fptr, naxis2, i2, nbytes, buffer, status);
            (fptr->Fptr)->rowlength = newlen;  /* new row length */

            ffptbb(fptr, naxis2, i1, nbytes, buffer, status); /* write row */
            (fptr->Fptr)->rowlength = naxis1;  /* reset to orig value */

            i1 += nbytes;
            i2 += nbytes;
            nbytes = 10000;
          }
        }
    }
    return(*status);
}